

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedArrayBuffer.cpp
# Opt level: O3

JavascriptSharedArrayBuffer *
Js::JavascriptSharedArrayBuffer::Create(uint32 length,DynamicType *type)

{
  Recycler *this;
  ScriptContext *pSVar1;
  Recycler *alloc;
  SharedArrayBuffer *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pSVar1 = Js::Type::GetScriptContext(&type->super_Type);
  this = pSVar1->recycler;
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_8e234c3;
  data.filename._0_4_ = 0x1a3;
  alloc = Memory::Recycler::TrackAllocInfo(this,(TrackAllocData *)local_50);
  this_00 = (SharedArrayBuffer *)new<Memory::Recycler>(0x30,alloc,0x39e810);
  JavascriptSharedArrayBuffer((JavascriptSharedArrayBuffer *)this_00,type);
  SharedArrayBuffer::Init(this_00,length,length);
  Memory::Recycler::AddExternalMemoryUsage(this,(ulong)length);
  return (JavascriptSharedArrayBuffer *)this_00;
}

Assistant:

JavascriptSharedArrayBuffer* JavascriptSharedArrayBuffer::Create(uint32 length, DynamicType * type)
    {
        Recycler* recycler = type->GetScriptContext()->GetRecycler();
        JavascriptSharedArrayBuffer* result = RecyclerNewFinalized(recycler, JavascriptSharedArrayBuffer, type);
        result->Init(length, length);
        recycler->AddExternalMemoryUsage(length);
        return result;
    }